

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O0

forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> __thiscall
TasGrid::readNodeDataList<TasGrid::IO::mode_ascii_type>
          (TasGrid *this,istream *is,size_t num_dimensions,size_t num_outputs)

{
  NodeData local_70;
  int local_40;
  int i;
  int local_30;
  undefined1 local_29;
  int num_nodes;
  size_t num_outputs_local;
  size_t num_dimensions_local;
  istream *is_local;
  forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *data;
  
  local_29 = 0;
  _num_nodes = (istream *)num_outputs;
  num_outputs_local = num_dimensions;
  num_dimensions_local = (size_t)is;
  is_local = (istream *)this;
  ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::forward_list
            ((forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)this);
  local_30 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>((istream *)num_dimensions_local);
  for (local_40 = 0; local_40 < local_30; local_40 = local_40 + 1) {
    IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
              (&local_70.point,(IO *)num_dimensions_local,(istream *)num_outputs_local,num_outputs);
    IO::readVector<TasGrid::IO::mode_ascii_type,double,unsigned_long>
              (&local_70.value,(IO *)num_dimensions_local,_num_nodes,num_outputs);
    ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::
    emplace_front<TasGrid::NodeData>
              ((forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)this,&local_70
              );
    NodeData::~NodeData(&local_70);
  }
  return (_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>)
         (_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>)this;
}

Assistant:

std::forward_list<NodeData> readNodeDataList(std::istream &is, size_t num_dimensions, size_t num_outputs){
    std::forward_list<NodeData> data;
    int num_nodes = IO::readNumber<iomode, int>(is);

    for(int i=0; i<num_nodes; i++){
        data.emplace_front(NodeData{
                            IO::readVector<iomode, int>(is, num_dimensions), // point
                            IO::readVector<iomode, double>(is, num_outputs)  // value
                           });
    }

    return data;
}